

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>,testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>>>>
::operator()(void *this,char *value_text,
            Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>
            *x)

{
  bool bVar1;
  ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
  *this_00;
  ostream *poVar2;
  AssertionResult *other;
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> *a;
  Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record> *a_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  AssertionResult AStack_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  Matcher<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
  matcher;
  StringMatchResultListener listener;
  stringstream ss;
  undefined8 local_198 [48];
  
  _ss = (Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
         *)0x0;
  local_198[0] = 0;
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::reserve((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
             *)&ss,2);
  CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
  ::operator()((Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                *)&listener,
               (CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
                *)(value_text + 0x18),a);
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::push_back((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
               *)&ss,(value_type *)&listener);
  MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
  ::~MatcherBase((MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                  *)&listener);
  CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
  ::operator()((Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                *)&listener,
               (CastAndAppendTransform<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>
                *)value_text,a_00);
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::push_back((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
               *)&ss,(value_type *)&listener);
  MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
  ::~MatcherBase((MatcherBase<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>
                  *)&listener);
  this_00 = (ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
  ::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>*,std::vector<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>,std::allocator<testing::Matcher<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const&>>>>>
            (this_00,_ss,
             (__normal_iterator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_*,_std::vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>_>
              )0x0);
  Matcher<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
  ::Matcher(&matcher,(MatcherInterface<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
                      *)this_00);
  std::
  vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
  ::~vector((vector<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>,_std::allocator<testing::Matcher<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_&>_>_>
             *)&ss);
  bVar1 = MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
          ::Matches(&matcher.
                     super_MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
                    ,x);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<((ostream *)local_198,"Value of: ");
    poVar2 = std::operator<<(poVar2,"collector.Get()");
    poVar2 = std::operator<<(poVar2,"\n");
    std::operator<<(poVar2,"Expected: ");
    MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
    ::DescribeTo(&matcher.
                  super_MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
                 ,(ostream *)local_198);
    StringMatchResultListener::StringMatchResultListener(&listener);
    bVar1 = MatchPrintAndExplain<absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const,absl::lts_20250127::Span<google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record_const>const&>
                      (x,&matcher,&listener.super_MatchResultListener);
    if (bVar1) {
      std::operator<<((ostream *)local_198,
                      "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                     );
    }
    poVar2 = std::operator<<((ostream *)local_198,"\n  Actual: ");
    std::__cxx11::stringbuf::str();
    std::operator<<(poVar2,(string *)&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<(&AStack_388,&local_378);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    std::__cxx11::string::~string((string *)&local_378);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&AStack_388.message_);
    StringMatchResultListener::~StringMatchResultListener(&listener);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
  ::~MatcherBase(&matcher.
                  super_MatcherBase<const_absl::lts_20250127::Span<const_google::protobuf::io::(anonymous_namespace)::FakeAnnotationCollector::Record>_&>
                );
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }